

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O2

int64_t pick_interinter_seg(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,uint8_t *p0,uint8_t *p1,
                           int16_t *residual1,int16_t *diff10,uint64_t *best_sse)

{
  byte bVar1;
  uint8_t uVar2;
  uint uVar3;
  uint8_t *puVar4;
  int iVar5;
  uint64_t uVar6;
  long lVar7;
  uint uVar8;
  undefined7 in_register_00000011;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  int64_t *dist_00;
  int rate;
  ulong local_80a0;
  uint8_t *local_8098;
  uint8_t *local_8090;
  ulong local_8088;
  MB_MODE_INFO *local_8080;
  uint8_t *local_8078;
  uint8_t *local_8070;
  ulong local_8068;
  long local_8060;
  int16_t *local_8058;
  int64_t dist;
  uint8_t *tmp_mask [2];
  uint8_t seg_mask [32768];
  
  uVar12 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
  bVar1 = "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[uVar12];
  uVar11 = 1 << (bVar1 & 0x1f);
  uVar3 = ((x->e_mbd).cur_buf)->flags;
  uVar8 = 0;
  if ((uVar3 & 8) != 0) {
    uVar8 = (x->e_mbd).bd * 2 - 0x10;
  }
  local_8080 = *(x->e_mbd).mi;
  uVar2 = block_size_wide[uVar12];
  local_8088 = (ulong)block_size_high[uVar12];
  tmp_mask[0] = (x->e_mbd).seg_mask;
  tmp_mask[1] = seg_mask;
  local_8070 = (uint8_t *)((ulong)p0 >> 1);
  local_8078 = (uint8_t *)((ulong)p1 >> 1);
  local_8060 = (long)((1 << ((byte)uVar8 & 0x1f)) >> 1);
  local_8068 = (ulong)uVar8;
  lVar10 = 0x7fffffffffffffff;
  local_80a0 = 0;
  local_8098 = p0;
  local_8090 = p1;
  local_8058 = residual1;
  for (uVar12 = 0; uVar12 != 2; uVar12 = uVar12 + 1) {
    puVar4 = tmp_mask[uVar12];
    iVar5 = (int)uVar2;
    if ((uVar3 & 8) == 0) {
      (*av1_build_compound_diffwtd_mask)
                (puVar4,(DIFFWTD_MASK_TYPE)uVar12,local_8098,iVar5,local_8090,iVar5,(int)local_8088,
                 iVar5);
    }
    else {
      (*av1_build_compound_diffwtd_mask_highbd)
                (puVar4,(DIFFWTD_MASK_TYPE)uVar12,local_8070,iVar5,local_8078,iVar5,(int)local_8088,
                 iVar5,(x->e_mbd).bd);
    }
    dist_00 = (int64_t *)0xa32953;
    uVar6 = (*av1_wedge_sse_from_residuals)(local_8058,diff10,puVar4,uVar11);
    uVar9 = uVar6 + local_8060 >> ((byte)local_8068 & 0x3f);
    model_rd_with_curvfit
              ((AV1_COMP *)x,(MACROBLOCK *)(ulong)bsize,BLOCK_4X4,(int)uVar9,(ulong)uVar11,
               (int)&rate,(int *)&dist,dist_00);
    lVar7 = dist * 0x80 + ((long)x->rdmult * (long)rate + 0x100 >> 9);
    if (lVar7 < lVar10) {
      *best_sse = uVar9;
      local_80a0 = uVar12 & 0xffffffff;
      lVar10 = lVar7;
    }
  }
  (local_8080->interinter_comp).mask_type = (DIFFWTD_MASK_TYPE)local_80a0;
  if ((DIFFWTD_MASK_TYPE)local_80a0 == '\x01') {
    memcpy((x->e_mbd).seg_mask,seg_mask,(long)(2 << (bVar1 & 0x1f)));
  }
  return lVar10;
}

Assistant:

static int64_t pick_interinter_seg(const AV1_COMP *const cpi,
                                   MACROBLOCK *const x, const BLOCK_SIZE bsize,
                                   const uint8_t *const p0,
                                   const uint8_t *const p1,
                                   const int16_t *const residual1,
                                   const int16_t *const diff10,
                                   uint64_t *best_sse) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  const int N = 1 << num_pels_log2_lookup[bsize];
  int rate;
  int64_t dist;
  DIFFWTD_MASK_TYPE cur_mask_type;
  int64_t best_rd = INT64_MAX;
  DIFFWTD_MASK_TYPE best_mask_type = 0;
  const int hbd = is_cur_buf_hbd(xd);
  const int bd_round = hbd ? (xd->bd - 8) * 2 : 0;
  DECLARE_ALIGNED(16, uint8_t, seg_mask[2 * MAX_SB_SQUARE]);
  uint8_t *tmp_mask[2] = { xd->seg_mask, seg_mask };
  // try each mask type and its inverse
  for (cur_mask_type = 0; cur_mask_type < DIFFWTD_MASK_TYPES; cur_mask_type++) {
    // build mask and inverse
#if CONFIG_AV1_HIGHBITDEPTH
    if (hbd)
      av1_build_compound_diffwtd_mask_highbd(
          tmp_mask[cur_mask_type], cur_mask_type, CONVERT_TO_BYTEPTR(p0), bw,
          CONVERT_TO_BYTEPTR(p1), bw, bh, bw, xd->bd);
    else
      av1_build_compound_diffwtd_mask(tmp_mask[cur_mask_type], cur_mask_type,
                                      p0, bw, p1, bw, bh, bw);
#else
    (void)hbd;
    av1_build_compound_diffwtd_mask(tmp_mask[cur_mask_type], cur_mask_type, p0,
                                    bw, p1, bw, bh, bw);
#endif  // CONFIG_AV1_HIGHBITDEPTH

    // compute rd for mask
    uint64_t sse = av1_wedge_sse_from_residuals(residual1, diff10,
                                                tmp_mask[cur_mask_type], N);
    sse = ROUND_POWER_OF_TWO(sse, bd_round);

    model_rd_sse_fn[MODELRD_TYPE_MASKED_COMPOUND](cpi, x, bsize, 0, sse, N,
                                                  &rate, &dist);
    const int64_t rd0 = RDCOST(x->rdmult, rate, dist);

    if (rd0 < best_rd) {
      best_mask_type = cur_mask_type;
      best_rd = rd0;
      *best_sse = sse;
    }
  }
  mbmi->interinter_comp.mask_type = best_mask_type;
  if (best_mask_type == DIFFWTD_38_INV) {
    memcpy(xd->seg_mask, seg_mask, N * 2);
  }
  return best_rd;
}